

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-test.capnp.h
# Opt level: O2

Builder __thiscall capnp::TestBase64Union::Builder::initFoo(Builder *this,uint size)

{
  ArrayPtr<unsigned_char> AVar1;
  PointerBuilder local_18;
  
  *(undefined2 *)(this->_builder).data = 0;
  local_18.pointer = (this->_builder).pointers;
  local_18.segment = (this->_builder).segment;
  local_18.capTable = (this->_builder).capTable;
  AVar1 = (ArrayPtr<unsigned_char>)capnp::_::PointerBuilder::initBlob<capnp::Data>(&local_18,size);
  return (Builder)AVar1;
}

Assistant:

inline  ::capnp::Data::Builder TestBase64Union::Builder::initFoo(unsigned int size) {
  _builder.setDataField<TestBase64Union::Which>(
      ::capnp::bounded<0>() * ::capnp::ELEMENTS, TestBase64Union::FOO);
  return ::capnp::_::PointerHelpers< ::capnp::Data>::init(_builder.getPointerField(
      ::capnp::bounded<0>() * ::capnp::POINTERS), size);
}